

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-wizard.c
# Opt level: O2

void wiz_drop_object(object *obj)

{
  loc grid;
  uint8_t uVar1;
  object *obj_local;
  
  if (obj != (object *)0x0) {
    obj->origin = '\x13';
    obj_local = obj;
    uVar1 = convert_depth_to_origin((int)player->depth);
    obj->origin_depth = uVar1;
    grid.x = (player->grid).x;
    grid.y = (player->grid).y;
    drop_near((chunk *)cave,&obj_local,L'\0',grid,true,true);
  }
  return;
}

Assistant:

static void wiz_drop_object(struct object *obj)
{
	if (obj == NULL) return;

	/* Mark as cheat and where it was created */
	obj->origin = ORIGIN_CHEAT;
	obj->origin_depth = convert_depth_to_origin(player->depth);

	/* Drop the object from heaven. */
	drop_near(cave, &obj, 0, player->grid, true, true);
}